

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_seg.c
# Opt level: O1

int mk_seg(acmod_set_t *acmod_set,uint16 *seg,uint32 n_frame,acmod_id_t *phone,uint32 *start,
          uint32 *len,uint32 n_phone)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  if (n_phone != 0) {
    uVar1 = 0;
    uVar2 = 0;
    do {
      if (-1 < (short)seg[uVar2]) {
        __assert_fail("seg[f] & 0x8000",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/mk_seg.c"
                      ,0x47,
                      "int mk_seg(acmod_set_t *, uint16 *, uint32, acmod_id_t *, uint32 *, uint32 *, uint32)"
                     );
      }
      uVar5 = uVar2 + 1;
      if (uVar2 + 1 < n_frame) {
        uVar5 = n_frame;
      }
      start[uVar1] = uVar2;
      uVar4 = (ulong)uVar2;
      do {
        uVar3 = uVar5;
        if (uVar5 - 1 == (int)uVar4) break;
        uVar3 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar3;
      } while (-1 < (short)seg[uVar4]);
      len[uVar1] = uVar3 - uVar2;
      uVar1 = uVar1 + 1;
      uVar2 = uVar3;
    } while (uVar1 != n_phone);
  }
  return 0;
}

Assistant:

int
mk_seg(acmod_set_t *acmod_set,
       uint16 *seg,
       uint32 n_frame,
       acmod_id_t *phone,
       uint32 *start,
       uint32 *len,
       uint32 n_phone)
{
    uint32 phone_i;
    uint32 f;

    /*
     * BEWARE: This routine does not check the consistency of
     *		phone[] with seg[].  See ck_seg() for this test.
     */
       

    for (phone_i = 0, f = 0; phone_i < n_phone; phone_i++) {
	assert(seg[f] & 0x8000);	/* beginning of phone bit */
	
	start[phone_i] = f;
	
	/* skip over the remaining frames in the segment */
	for (++f; (f < n_frame) && !(seg[f] & 0x8000); f++);
	
	len[phone_i] = f - start[phone_i];
    }
	
    return S3_SUCCESS;
}